

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::GenerateXMLLaunched(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  bool bVar1;
  unsigned_long uVar2;
  char *fname;
  _Rb_tree_node_base *p_Var3;
  cmCTestBuildHandler *this_00;
  unsigned_long dindex;
  int iVar4;
  Directory launchDir;
  cmFileTimeComparison ftc;
  Fragments fragments;
  undefined1 local_d0 [32];
  cmFileTimeComparison local_b0;
  cmXMLWriter *local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->CTestLaunchDir)._M_string_length != 0) {
    local_a8 = xml;
    cmFileTimeComparison::cmFileTimeComparison(&local_b0);
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0._M_impl.super__Rb_tree_header._M_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar4 = this->MaxErrors;
    local_d0._12_4_ = this->MaxWarnings;
    local_a0._M_impl.super__Rb_tree_key_compare<cmCTestBuildHandler::FragmentCompare>._M_key_compare
    .FTC = (FragmentCompare)(FragmentCompare)&local_b0;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
    cmsys::Directory::Directory((Directory *)local_d0);
    local_d0._24_8_ = &this->CTestLaunchDir;
    cmsys::Directory::Load((Directory *)local_d0,(string *)local_d0._24_8_);
    local_d0._16_8_ = this;
    uVar2 = cmsys::Directory::GetNumberOfFiles((Directory *)local_d0);
    for (dindex = 0; p_Var3 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left,
        uVar2 != dindex; dindex = dindex + 1) {
      this_00 = (cmCTestBuildHandler *)local_d0;
      fname = cmsys::Directory::GetFile((Directory *)this_00,dindex);
      bVar1 = IsLaunchedErrorFile(this_00,fname);
      if (bVar1 && iVar4 != 0) {
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_d0._24_8_,"/");
        std::operator+(&local_50,&local_70,fname);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
                    *)&local_a0,&local_50);
        iVar4 = iVar4 + -1;
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        *(int *)(local_d0._16_8_ + 0x380) = *(int *)(local_d0._16_8_ + 0x380) + 1;
      }
      else {
        bVar1 = IsLaunchedWarningFile(this_00,fname);
        if ((bVar1) && (local_d0._12_4_ != 0)) {
          std::operator+(&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0._24_8_,"/");
          std::operator+(&local_50,&local_70,fname);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
                      *)&local_a0,&local_50);
          local_d0._12_4_ = local_d0._12_4_ + -1;
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          *(int *)(local_d0._16_8_ + 900) = *(int *)(local_d0._16_8_ + 900) + 1;
        }
      }
    }
    for (; (_Rb_tree_header *)p_Var3 != &local_a0._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      cmXMLWriter::FragmentFile(local_a8,*(char **)(p_Var3 + 1));
    }
    cmsys::Directory::~Directory((Directory *)local_d0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_a0);
    cmFileTimeComparison::~cmFileTimeComparison(&local_b0);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLaunched(cmXMLWriter& xml)
{
  if(this->CTestLaunchDir.empty())
    {
    return;
    }

  // Sort XML fragments in chronological order.
  cmFileTimeComparison ftc;
  FragmentCompare fragmentCompare(&ftc);
  typedef std::set<std::string, FragmentCompare> Fragments;
  Fragments fragments(fragmentCompare);

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  // Identify fragments on disk.
  cmsys::Directory launchDir;
  launchDir.Load(this->CTestLaunchDir);
  unsigned long n = launchDir.GetNumberOfFiles();
  for(unsigned long i=0; i < n; ++i)
    {
    const char* fname = launchDir.GetFile(i);
    if(this->IsLaunchedErrorFile(fname) && numErrorsAllowed)
      {
      numErrorsAllowed--;
      fragments.insert(this->CTestLaunchDir + "/" + fname);
      ++this->TotalErrors;
      }
    else if(this->IsLaunchedWarningFile(fname) && numWarningsAllowed)
      {
      numWarningsAllowed--;
      fragments.insert(this->CTestLaunchDir + "/" + fname);
      ++this->TotalWarnings;
      }
    }

  // Copy the fragments into the final XML file.
  for(Fragments::const_iterator fi = fragments.begin();
      fi != fragments.end(); ++fi)
    {
    xml.FragmentFile(fi->c_str());
    }
}